

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

int QAnyStringView::compare(QAnyStringView lhs,QAnyStringView rhs,CaseSensitivity cs)

{
  int iVar1;
  ulong uVar2;
  QLatin1StringView rhs_00;
  QBasicUtf8StringView<false> rhs_01;
  QLatin1StringView rhs_02;
  QByteArrayView rhs_03;
  QLatin1StringView lhs_00;
  QLatin1StringView lhs_01;
  QBasicUtf8StringView<false> lhs_02;
  QByteArrayView lhs_03;
  
  lhs_02.m_data = lhs.field_0;
  rhs_01.m_data = rhs.field_0;
  lhs_02.m_size = lhs.m_size & 0x3fffffffffffffff;
  uVar2 = rhs.m_size & 0xc000000000000000;
  rhs_01.m_size = rhs.m_size & 0x3fffffffffffffff;
  if ((lhs.m_size & 0xc000000000000000) == 0x4000000000000000) {
    if (uVar2 != 0x4000000000000000) {
      lhs_01.m_data = lhs_02.m_data;
      lhs_01.m_size = lhs_02.m_size;
      iVar1 = QtPrivate::compareStrings(lhs_01,rhs_01,cs);
      return iVar1;
    }
    rhs_00.m_data = rhs_01.m_data;
    rhs_00.m_size = rhs_01.m_size;
    lhs_00.m_data = lhs_02.m_data;
    lhs_00.m_size = lhs_02.m_size;
    iVar1 = QtPrivate::compareStrings(lhs_00,rhs_00,cs);
    return iVar1;
  }
  if (uVar2 != 0x4000000000000000) {
    rhs_03.m_data = (storage_type *)rhs_01.m_data;
    rhs_03.m_size = rhs_01.m_size;
    lhs_03.m_data = (storage_type *)lhs_02.m_data;
    lhs_03.m_size = lhs_02.m_size;
    iVar1 = QUtf8::compareUtf8(lhs_03,rhs_03,cs);
    return iVar1;
  }
  rhs_02.m_data = rhs_01.m_data;
  rhs_02.m_size = rhs_01.m_size;
  iVar1 = QtPrivate::compareStrings(lhs_02,rhs_02,cs);
  return iVar1;
}

Assistant:

int QAnyStringView::compare(QAnyStringView lhs, QAnyStringView rhs, Qt::CaseSensitivity cs) noexcept
{
    return lhs.visit([rhs, cs](auto lhs) {
        return rhs.visit([lhs, cs](auto rhs) {
            return QtPrivate::compareStrings(lhs, rhs, cs);
        });
    });
}